

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomMesh *mesh,uint32_t indent,
          bool closing_brace)

{
  optional<tinyusdz::Interpolation> oVar1;
  anon_struct_8_0_00000001_for___align *paVar2;
  tinyusdz *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *poVar6;
  optional<tinyusdz::Interpolation> *poVar7;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  uint indent_00;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar10;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  FamilyType v;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  optional<tinyusdz::Interpolation> extraout_RDX;
  optional<tinyusdz::Interpolation> oVar11;
  undefined7 in_register_00000081;
  string *name;
  uint32_t in_R9D;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string attr_name;
  stringstream ss;
  string local_298;
  string local_278;
  undefined1 local_254;
  string local_250 [16];
  undefined8 local_240 [3];
  long local_228;
  undefined1 local_220 [48];
  long local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  name = (string *)CONCAT71(in_register_00000081,closing_brace);
  _local_254 = indent;
  local_220._32_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_298,(pprint *)((ulong)mesh & 0xffffffff),n);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  to_string_abi_cxx11_(&local_278,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," Mesh \"",7);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
  paVar12 = &local_278.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar12) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  bVar5 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar10 = n_00;
  if (bVar5) {
    pprint::Indent_abi_cxx11_(&local_298,(pprint *)((ulong)mesh & 0xffffffff),n_00);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_(&local_298,this + 0x1a10,(PrimMeta *)(ulong)((int)mesh + 1),indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    uVar10 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      uVar10 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_298,(pprint *)((ulong)mesh & 0xffffffff),uVar10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    uVar10 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      uVar10 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_298,(pprint *)((ulong)mesh & 0xffffffff),uVar10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"points","");
  indent_00 = (int)mesh + 1;
  local_220._24_8_ = (pprint *)((ulong)mesh & 0xffffffff);
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            (&local_298,this + 0x1e68,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)&local_278,(string *)(ulong)indent_00,(uint32_t)name);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar12) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"normals","");
  print_typed_attr<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            (&local_298,this + 0x20e0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              *)&local_278,(string *)(ulong)indent_00,(uint32_t)name);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar12) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"faceVertexIndices","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_298,this + 0x2848,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,(uint32_t)name);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar12) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"faceVertexCounts","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_298,this + 0x25d0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,(uint32_t)name);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar12) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (this[0x2ac0] == (tinyusdz)0x1) {
    local_220._40_4_ = *(undefined4 *)(this + 0x2bb8);
    local_278._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"skel:skeleton","");
    name = (string *)(ulong)indent_00;
    anon_unknown_173::print_relationship
              (&local_298,(Relationship *)(this + 0x2ac8),(ListEditQual *)(local_220 + 0x28),
               SUB81(&local_278,0),name,in_R9D);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  paVar12 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"skel:blendShapes","");
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_298,this + 0x43e8,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             &local_278,(string *)(ulong)indent_00,(uint32_t)name);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar12) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (this[0x4638] == (tinyusdz)0x1) {
    local_220._40_4_ = *(undefined4 *)(this + 0x4730);
    local_278._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"skel:blendShapeTargets","");
    name = (string *)(ulong)indent_00;
    anon_unknown_173::print_relationship
              (&local_298,(Relationship *)(this + 0x4640),(ListEditQual *)(local_220 + 0x28),
               SUB81(&local_278,0),name,in_R9D);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  uVar10 = (uint32_t)name;
  p_Var9 = *(_Rb_tree_node_base **)(this + 0x4960);
  local_220._16_8_ = this;
  if (p_Var9 != (_Rb_tree_node_base *)(this + 0x4950)) {
    do {
      std::operator+(&local_298,"subsetFamily:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var9 + 1));
      poVar7 = (optional<tinyusdz::Interpolation> *)std::__cxx11::string::append((char *)&local_298)
      ;
      oVar1 = (optional<tinyusdz::Interpolation>)(poVar7 + 2);
      if (*poVar7 == oVar1) {
        local_278.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
        local_278.field_2._8_8_ = poVar7[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
        local_278._M_dataplus._M_p = (pointer)*poVar7;
      }
      oVar11 = poVar7[1];
      *poVar7 = oVar1;
      poVar7[1].has_value_ = false;
      *(undefined3 *)&poVar7[1].field_0x1 = 0;
      poVar7[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
      poVar7[2].has_value_ = false;
      local_278._M_string_length = (size_type)oVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        oVar11 = extraout_RDX;
      }
      pprint::Indent_abi_cxx11_
                ((string *)(local_220 + 0x28),(pprint *)(ulong)indent_00,oVar11._0_4_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)CONCAT44(local_220._44_4_,local_220._40_4_),local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"uniform token ",0xe);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_278._M_dataplus._M_p,local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      to_string_abi_cxx11_((string *)local_1d8,(tinyusdz *)(ulong)p_Var9[2]._M_color,v);
      local_250._0_8_ = local_240;
      std::__cxx11::string::_M_construct<char_const*>(local_250,"\"","");
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_250._0_8_,local_250._8_8_ + local_250._0_8_);
      std::__cxx11::string::_M_append((char *)&local_298,local_1d8._0_8_);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_298,local_250._0_8_);
      paVar2 = (anon_struct_8_0_00000001_for___align *)(plVar8 + 2);
      if ((anon_struct_8_0_00000001_for___align *)*plVar8 == paVar2) {
        local_220._0_8_ = *paVar2;
        local_220._8_8_ = plVar8[3];
        local_240[2] = local_220;
      }
      else {
        local_220._0_8_ = *paVar2;
        local_240[2] = (anon_struct_8_0_00000001_for___align *)*plVar8;
      }
      local_228 = plVar8[1];
      *plVar8 = (long)paVar2;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_240[2],local_228);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((undefined1 *)local_240[2] != local_220) {
        operator_delete((void *)local_240[2],local_220._0_8_ + 1);
      }
      if ((undefined8 *)local_250._0_8_ != local_240) {
        operator_delete((void *)local_250._0_8_,local_240[0] + 1);
      }
      if (local_1d8._0_8_ != (long)local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_220._44_4_,local_220._40_4_) != &local_1e8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_220._44_4_,local_220._40_4_),
                        local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      uVar10 = (uint32_t)name;
    } while (p_Var9 != (_Rb_tree_node_base *)(this + 0x4950));
  }
  uVar3 = local_220._16_8_;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  this_00 = (tinyusdz *)(local_220._16_8_ + 0x2dd0);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"cornerIndices","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_298,this_00,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"cornerSharpnesses","");
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_298,(tinyusdz *)(uVar3 + 0x3048),
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"creaseIndices","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_298,(tinyusdz *)(uVar3 + 0x32c0),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"creaseLengths","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_298,(tinyusdz *)(uVar3 + 0x3538),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"creaseSharpnesses","");
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_298,(tinyusdz *)(uVar3 + 0x37b0),
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"holeIndices","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_298,(tinyusdz *)(uVar3 + 0x3a28),
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             &local_278,(string *)(ulong)indent_00,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"subdivisonScheme","");
  print_typed_token_attr<tinyusdz::GeomMesh::SubdivisionScheme>
            (&local_298,
             (TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *)(uVar3 + 0x3f28),
             &local_278,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"interpolateBoundary","");
  print_typed_token_attr<tinyusdz::GeomMesh::InterpolateBoundary>
            (&local_298,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
              *)(uVar3 + 0x3ca0),&local_278,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"faceVaryingLinearInterpolation","");
  print_typed_token_attr<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
            (&local_298,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
              *)(uVar3 + 0x4160),&local_278,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  uVar4 = local_220._24_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  print_gprim_predefined<tinyusdz::GeomMesh>(&local_298,(GeomMesh *)uVar3,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_298,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(uVar3 + 0x1970),indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  uVar10 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    uVar10 = extraout_EDX_04;
  }
  if (local_254 != '\0') {
    pprint::Indent_abi_cxx11_(&local_298,(pprint *)(uVar4 & 0xffffffff),uVar10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  uVar3 = local_220._32_8_;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return (string *)uVar3;
}

Assistant:

std::string to_string(const GeomMesh &mesh, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(mesh.spec) << " Mesh \""
     << mesh.name << "\"\n";
  if (mesh.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(mesh.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(mesh.points, "points", indent + 1);
  ss << print_typed_attr(mesh.normals, "normals", indent + 1);
  ss << print_typed_attr(mesh.faceVertexIndices, "faceVertexIndices",
                         indent + 1);
  ss << print_typed_attr(mesh.faceVertexCounts, "faceVertexCounts", indent + 1);

  if (mesh.skeleton) {
    ss << print_relationship(mesh.skeleton.value(),
                             mesh.skeleton.value().get_listedit_qual(),
                             /* custom */ false, "skel:skeleton", indent + 1);
  }

  ss << print_typed_attr(mesh.blendShapes, "skel:blendShapes", indent + 1);
  if (mesh.blendShapeTargets) {
    ss << print_relationship(mesh.blendShapeTargets.value(),
                             mesh.blendShapeTargets.value().get_listedit_qual(),
                             /* custom */ false, "skel:blendShapeTargets",
                             indent + 1);
  }

  for (const auto &item : mesh.subsetFamilyTypeMap) {
    std::string attr_name = "subsetFamily:" + item.first.str() + ":familyType";
    // TODO: Support connection attr?
    ss << pprint::Indent(indent+1) << "uniform token " << attr_name << " = " << quote(to_string(item.second)) << "\n";
  }

  // subdiv
  ss << print_typed_attr(mesh.cornerIndices, "cornerIndices", indent + 1);
  ss << print_typed_attr(mesh.cornerSharpnesses, "cornerSharpnesses",
                         indent + 1);
  ss << print_typed_attr(mesh.creaseIndices, "creaseIndices", indent + 1);
  ss << print_typed_attr(mesh.creaseLengths, "creaseLengths", indent + 1);
  ss << print_typed_attr(mesh.creaseSharpnesses, "creaseSharpnesses",
                         indent + 1);
  ss << print_typed_attr(mesh.holeIndices, "holeIndices", indent + 1);

  ss << print_typed_token_attr(mesh.subdivisionScheme, "subdivisonScheme",
                               indent + 1);
  ss << print_typed_token_attr(mesh.interpolateBoundary, "interpolateBoundary",
                               indent + 1);
  ss << print_typed_token_attr(mesh.faceVaryingLinearInterpolation,
                               "faceVaryingLinearInterpolation", indent + 1);

  ss << print_gprim_predefined(mesh, indent + 1);

#if 0
  // GeomSubset.
  for (const auto &subset : mesh.geom_subset_children) {
    ss << to_string(subset, indent + 1, /* closing_brace */ true);
  }
#endif

  ss << print_props(mesh.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}